

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNextNoCache
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  PropertyId PVar1;
  DynamicObject *pDVar2;
  JavascriptString *pJVar3;
  PropertyAttributes *propertyId_00;
  bool bVar4;
  EnumeratorFlags EVar5;
  InlineCacheFlags IVar6;
  BOOL BVar7;
  BigPropertyIndex BVar8;
  DynamicObject **ppDVar9;
  DynamicObject *pDVar10;
  DynamicType *typeToEnumerate;
  ScriptContext **ppSVar11;
  PropertyRecordUsageCache *pPVar12;
  JavascriptString *pJVar13;
  PolymorphicInlineCache *polymorphicInlineCache;
  Type *typeWithoutProperty;
  RecyclableObject *startingObject;
  PropertyValueInfo info;
  JavascriptString *pJStack_28;
  BigPropertyIndex newIndex;
  JavascriptString *propertyString;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  DynamicObjectPropertyEnumerator *this_local;
  
  pJStack_28 = (JavascriptString *)0x0;
  info._60_4_ = this->objectIndex;
  propertyString = (JavascriptString *)attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)this;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&startingObject);
  ppDVar9 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&this->object);
  pDVar2 = *ppDVar9;
  while( true ) {
    info._60_4_ = info._60_4_ + 1;
    PropertyValueInfo::ClearCacheInfo((PropertyValueInfo *)&startingObject);
    pDVar10 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->(&this->object);
    propertyId_00 = attributes_local;
    pJVar3 = propertyString;
    typeToEnumerate = GetTypeToEnumerate(this);
    EVar5 = this->flags;
    ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)this);
    BVar7 = DynamicObject::FindNextProperty
                      (pDVar10,(BigPropertyIndex *)&info.isFunctionPIC,&stack0xffffffffffffffd8,
                       (PropertyId *)propertyId_00,(PropertyAttributes *)pJVar3,typeToEnumerate,
                       EVar5,*ppSVar11,(PropertyValueInfo *)&startingObject);
    if ((BVar7 == 0) ||
       ((bVar4 = GetSnapShotSemantics(this), bVar4 &&
        (BVar8 = PropertyIndexToPropertyEnumeration(this,info._60_4_),
        this->initialPropertyCount <= BVar8)))) break;
    BVar7 = IsInternalPropertyId(*(PropertyId *)attributes_local);
    if (BVar7 == 0) {
LAB_014076a6:
      pPVar12 = PropertyValueInfo::GetPropertyRecordUsageCache((PropertyValueInfo *)&startingObject)
      ;
      if (pPVar12 != (PropertyRecordUsageCache *)0x0) {
        pPVar12 = PropertyValueInfo::GetPropertyRecordUsageCache
                            ((PropertyValueInfo *)&startingObject);
        bVar4 = PropertyRecordUsageCache::ShouldUseCache(pPVar12);
        pJVar3 = pJStack_28;
        if ((bVar4) &&
           (pJVar13 = (JavascriptString *)
                      PropertyValueInfo::GetProperty((PropertyValueInfo *)&startingObject),
           pJVar3 == pJVar13)) {
          ppDVar9 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                              ((WriteBarrierPtr *)&this->object);
          pDVar10 = *ppDVar9;
          PVar1 = *(PropertyId *)attributes_local;
          ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                               ((WriteBarrierPtr *)this);
          CacheOperators::CachePropertyRead
                    (pDVar2,&pDVar10->super_RecyclableObject,false,PVar1,false,
                     (PropertyValueInfo *)&startingObject,*ppSVar11);
          EVar5 = Js::operator&(this->flags,EphemeralReference);
          bVar4 = operator!(EVar5);
          if ((bVar4) &&
             (((bVar4 = PropertyValueInfo::IsStoreFieldCacheEnabled
                                  ((PropertyValueInfo *)&startingObject), bVar4 &&
               (bVar4 = PropertyValueInfo::IsWritable((PropertyValueInfo *)&startingObject), bVar4))
              && (IVar6 = PropertyValueInfo::GetFlags((PropertyValueInfo *)&startingObject),
                 (IVar6 & (InlineCacheSetterFlag|InlineCacheGetterFlag)) == InlineCacheNoFlags)))) {
            pPVar12 = PropertyValueInfo::GetPropertyRecordUsageCache
                                ((PropertyValueInfo *)&startingObject);
            polymorphicInlineCache = PropertyRecordUsageCache::GetStElemInlineCache(pPVar12);
            bVar4 = PropertyValueInfo::AllowResizingPolymorphicInlineCache
                              ((PropertyValueInfo *)&startingObject);
            PropertyValueInfo::SetCacheInfo
                      ((PropertyValueInfo *)&startingObject,polymorphicInlineCache,bVar4);
            ppDVar9 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                                ((WriteBarrierPtr *)&this->object);
            pDVar2 = *ppDVar9;
            pDVar10 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->(&this->object);
            typeWithoutProperty = RecyclableObject::GetType(&pDVar10->super_RecyclableObject);
            PVar1 = *(PropertyId *)attributes_local;
            ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                                 ((WriteBarrierPtr *)this);
            CacheOperators::CachePropertyWrite
                      (&pDVar2->super_RecyclableObject,false,typeWithoutProperty,PVar1,
                       (PropertyValueInfo *)&startingObject,*ppSVar11);
          }
        }
      }
      this->objectIndex = info._60_4_;
      return pJStack_28;
    }
  }
  info._60_4_ = info._60_4_ + -1;
  pJStack_28 = (JavascriptString *)0x0;
  PropertyValueInfo::ClearCacheInfo((PropertyValueInfo *)&startingObject);
  goto LAB_014076a6;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNextNoCache(PropertyId& propertyId, PropertyAttributes * attributes)
    {
        JavascriptString* propertyString = nullptr;
        BigPropertyIndex newIndex = this->objectIndex;
        PropertyValueInfo info;
        RecyclableObject * startingObject = this->object;
        do
        {
            newIndex++;
            PropertyValueInfo::ClearCacheInfo(&info);
            if (!this->object->FindNextProperty(newIndex, &propertyString, &propertyId, attributes,
                GetTypeToEnumerate(), flags, this->scriptContext, &info)
                || (GetSnapShotSemantics() && PropertyIndexToPropertyEnumeration(newIndex) >= initialPropertyCount))
            {
                // No more properties
                newIndex--;
                propertyString = nullptr;
                PropertyValueInfo::ClearCacheInfo(&info);
                break;
            }
        } while (Js::IsInternalPropertyId(propertyId));

        if (info.GetPropertyRecordUsageCache() != nullptr && info.GetPropertyRecordUsageCache()->ShouldUseCache() && propertyString == info.GetProperty())
        {
            CacheOperators::CachePropertyRead(startingObject, this->object, false, propertyId, false, &info, scriptContext);
            if ((!(this->flags & EnumeratorFlags::EphemeralReference)) && info.IsStoreFieldCacheEnabled() && info.IsWritable() && ((info.GetFlags() & (InlineCacheGetterFlag | InlineCacheSetterFlag)) == 0))
            {
                PropertyValueInfo::SetCacheInfo(&info, info.GetPropertyRecordUsageCache()->GetStElemInlineCache(), info.AllowResizingPolymorphicInlineCache());
                CacheOperators::CachePropertyWrite(this->object, false, this->object->GetType(), propertyId, &info, scriptContext);
            }
        }
        this->objectIndex = newIndex;
        return propertyString;
    }